

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

bool __thiscall
HighsSymmetryDetection::isFullOrbitope
          (HighsSymmetryDetection *this,ComponentData *componentData,HighsInt component,
          HighsSymmetries *symmetries)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  HighsLp *pHVar5;
  pointer piVar6;
  pointer piVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  pointer piVar13;
  ValueType *pVVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  int *piVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong __new_size;
  long lVar23;
  HighsInt col;
  unsigned_long local_c8;
  HighsHashTable<int,_void> colSet;
  HighsOrbitopeMatrix orbitopeMatrix;
  
  lVar23 = (long)component;
  piVar13 = (componentData->componentStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar11 = (long)piVar13[lVar23 + 1];
  lVar15 = (long)piVar13[lVar23];
  __new_size = lVar11 - lVar15;
  iVar20 = (int)__new_size;
  if (iVar20 == 1) {
    return false;
  }
  pHVar5 = this->model;
  while (lVar15 < lVar11) {
    iVar2 = (componentData->componentSets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15];
    if ((pHVar5->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar2] == kContinuous) {
      return false;
    }
    dVar1 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if (dVar1 != 0.0) {
      return false;
    }
    if (NAN(dVar1)) {
      return false;
    }
    dVar1 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    lVar15 = lVar15 + 1;
    if (dVar1 != 1.0) {
      return false;
    }
    if (NAN(dVar1)) {
      return false;
    }
  }
  piVar13 = (componentData->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  piVar6 = (componentData->permComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar13[lVar23];
  lVar11 = (long)iVar2;
  iVar10 = piVar6[lVar11];
  piVar7 = (componentData->numUnfixed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = piVar7[iVar10];
  if ((uVar3 & 1) != 0) {
    return false;
  }
  iVar4 = piVar13[lVar23 + 1];
  while (lVar11 = lVar11 + 1, lVar11 < iVar4) {
    if (piVar7[piVar6[lVar11]] != uVar3) {
      return false;
    }
  }
  iVar19 = (int)uVar3 >> 1;
  iVar17 = (int)((long)((ulong)(uint)(iVar20 >> 0x1f) << 0x20 | __new_size & 0xffffffff) /
                (long)iVar19);
  if (iVar17 * iVar19 != iVar20) {
    return false;
  }
  if (iVar4 - iVar2 != iVar17 + -1) {
    return false;
  }
  HighsOrbitopeMatrix::HighsOrbitopeMatrix(&orbitopeMatrix);
  colSet.entries._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&orbitopeMatrix.matrix,__new_size,(value_type_conflict2 *)&colSet);
  iVar10 = iVar10 * this->numActiveCols;
  piVar13 = (symmetries->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  orbitopeMatrix.rowLength = iVar17;
  orbitopeMatrix.numRows = iVar19;
  HighsHashTable<int,_void>::HighsHashTable(&colSet);
  lVar15 = 0;
  iVar20 = 0;
  for (lVar11 = 0; lVar11 < this->numActiveCols; lVar11 = lVar11 + 1) {
    lVar12 = (long)(this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(int *)((long)piVar13 + lVar15 + (long)iVar10 * 4)];
    if (lVar11 < lVar12) {
      if (iVar20 == iVar19) goto LAB_002f7cf6;
      piVar6 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar13[iVar10 + lVar12] != *(int *)((long)piVar6 + lVar15)) goto LAB_002f7cf6;
      piVar18 = (int *)((long)piVar13 + lVar15 + (long)iVar10 * 4);
      orbitopeMatrix.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar20] = piVar13[iVar10 + lVar12];
      orbitopeMatrix.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(long)orbitopeMatrix.numRows + (long)iVar20] = *piVar18;
      bVar8 = HighsHashTable<int,void>::insert<int&>
                        ((HighsHashTable<int,void> *)&colSet,(int *)((long)piVar6 + lVar15));
      if ((!bVar8) ||
         (bVar8 = HighsHashTable<int,void>::insert<int_const&>
                            ((HighsHashTable<int,void> *)&colSet,piVar18), !bVar8))
      goto LAB_002f7cf6;
      iVar20 = iVar20 + 1;
    }
    lVar15 = lVar15 + 4;
  }
  bVar8 = false;
  for (lVar11 = 2; lVar11 < orbitopeMatrix.rowLength; lVar11 = lVar11 + 1) {
    if (colSet.numElements != lVar11 * orbitopeMatrix.numRows) goto LAB_002f7cf6;
    piVar18 = orbitopeMatrix.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + colSet.numElements;
    piVar13 = (componentData->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar16 = orbitopeMatrix.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + (lVar11 + -1) * (long)orbitopeMatrix.numRows;
LAB_002f7b59:
    lVar12 = (long)(this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[*piVar16];
    lVar15 = (long)piVar13[lVar23];
    while( true ) {
      piVar6 = (symmetries->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar21 = lVar15;
      do {
        lVar15 = lVar21 + 1;
        if (piVar13[lVar23 + 1] <= lVar15) {
          if (bVar8) goto LAB_002f7cf6;
          bVar8 = true;
          piVar16 = orbitopeMatrix.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_002f7b59;
        }
        lVar22 = (long)(componentData->permComponents).super__Vector_base<int,_std::allocator<int>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar21 + 1] *
                 (long)this->numActiveCols;
        lVar21 = lVar15;
      } while (piVar6[lVar22 + lVar12] ==
               (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12]);
      pVVar14 = HighsHashTable<int,_void>::find(&colSet,piVar6 + lVar22 + lVar12);
      if (pVVar14 == (ValueType *)0x0) break;
      piVar13 = (componentData->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    lVar15 = 0;
    while (lVar15 < orbitopeMatrix.numRows) {
      piVar13 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar20 = piVar6[lVar22 + piVar13[piVar16[lVar15]]];
      *piVar18 = iVar20;
      if (piVar6[lVar22 + piVar13[iVar20]] != piVar16[lVar15]) goto LAB_002f7cf6;
      bVar9 = HighsHashTable<int,void>::insert<int&>((HighsHashTable<int,void> *)&colSet,piVar18);
      lVar15 = lVar15 + 1;
      piVar18 = piVar18 + 1;
      if (!bVar9) goto LAB_002f7cf6;
    }
  }
  if (colSet.numElements == __new_size) {
    for (piVar13 = orbitopeMatrix.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar13 !=
        orbitopeMatrix.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish; piVar13 = piVar13 + 1) {
      col = *piVar13;
      local_c8 = ((long)(symmetries->orbitopes).
                        super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(symmetries->orbitopes).
                       super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x68;
      HighsHashTable<int,int>::insert<int&,unsigned_long>
                ((HighsHashTable<int,int> *)&symmetries->columnToOrbitope,&col,&local_c8);
    }
    bVar8 = true;
    std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::
    emplace_back<HighsOrbitopeMatrix>(&symmetries->orbitopes,&orbitopeMatrix);
  }
  else {
LAB_002f7cf6:
    bVar8 = false;
  }
  HighsHashTable<int,_void>::~HighsHashTable(&colSet);
  HighsOrbitopeMatrix::~HighsOrbitopeMatrix(&orbitopeMatrix);
  return bVar8;
}

Assistant:

bool HighsSymmetryDetection::isFullOrbitope(const ComponentData& componentData,
                                            HighsInt component,
                                            HighsSymmetries& symmetries) {
  HighsInt componentSize = componentData.componentStarts[component + 1] -
                           componentData.componentStarts[component];
  if (componentSize == 1) return false;

  // check that component acts only on binary variables
  for (HighsInt i = componentData.componentStarts[component];
       i < componentData.componentStarts[component + 1]; ++i) {
    HighsInt col = componentData.componentSets[i];
    if (model->integrality_[col] == HighsVarType::kContinuous ||
        model->col_lower_[col] != 0.0 || model->col_upper_[col] != 1.0)
      return false;
  }

  // check that the number of unfixed variables in the first permutation is even
  HighsInt p0 =
      componentData
          .permComponents[componentData.permComponentStarts[component]];
  if (componentData.numUnfixed[p0] & 1) return false;

  // check that the other permutations in the component have the same number of
  // unfixed variables as the first one
  for (HighsInt k = componentData.permComponentStarts[component] + 1;
       k < componentData.permComponentStarts[component + 1]; ++k) {
    HighsInt p = componentData.permComponents[k];
    if (componentData.numUnfixed[p] != componentData.numUnfixed[p0]) {
      // printf("number of unfixed cols in perm %d: %d\n", p,
      //       componentData.numUnfixed[p]);
      // printf("wrong number of unfixed columns in permutation\n");
      return false;
    }
  }

  // all unfixed variables in the permutation must be part of a two cycle
  // and each two cycle defines one row of the orbitope. Hence the number
  // of unfixed variables in each permutation must be even and the number of
  // rows is the number of unfixed variables divided by two
  HighsInt orbitopeNumRows = componentData.numUnfixed[p0] >> 1;

  // if this component is a full orbitope the component size must be
  // divisible by the number of orbits and the result is the size of each
  // orbit
  HighsInt orbitopeOrbitSize = componentSize / orbitopeNumRows;
  if (orbitopeOrbitSize * orbitopeNumRows != componentSize) {
    // printf("wrong number of orbits (%d orbits for component of size %d)\n",
    //        orbitopeNumRows, componentSize);
    return false;
  }

  // the number of permutations must be n-1 where n is the size of the
  // orbits in the orbitope
  HighsInt componentNumPerms =
      componentData.permComponentStarts[component + 1] -
      componentData.permComponentStarts[component];
  if (componentNumPerms != (orbitopeOrbitSize - 1)) {
    // printf("wrong number of perms\n");
    return false;
  }

  // set up the first two columns of the orbitope matrix based on the first
  // permutation.
  HighsOrbitopeMatrix orbitopeMatrix;
  orbitopeMatrix.matrix.resize(componentSize, -1);
  orbitopeMatrix.numRows = orbitopeNumRows;
  orbitopeMatrix.rowLength = orbitopeOrbitSize;
  assert(componentSize == orbitopeMatrix.numRows * orbitopeMatrix.rowLength);

  const HighsInt* perm = symmetries.permutations.data() + p0 * numActiveCols;
  HighsHashTable<HighsInt> colSet;
  HighsInt m = 0;
  for (HighsInt j = 0; j < numActiveCols; ++j) {
    HighsInt jImagePos = vertexPosition[perm[j]];
    if (jImagePos <= j) continue;
    if (m == orbitopeNumRows) return false;

    // permutation should consist of two cycles
    if (perm[jImagePos] != vertexGroundSet[j]) return false;

    orbitopeMatrix.matrix[m] = vertexGroundSet[j];
    orbitopeMatrix.matrix[orbitopeMatrix.numRows + m] = perm[j];

    // Remember set of variables of the orbtiope matrix. Each variable should
    // occur only once, otherwise the permutation do not work out. Since we

    if (!colSet.insert(vertexGroundSet[j])) return false;
    if (!colSet.insert(perm[j])) return false;
    ++m;
  }

  // printf("set up first two columns of possible orbitope with permutation
  // %d\n",
  //        p0);

  HighsInt numColsAdded = 2;
  bool triedLeftExtension = false;

  while (numColsAdded < orbitopeMatrix.rowLength) {
    if (colSet.size() != numColsAdded * orbitopeMatrix.numRows) return false;

    HighsInt* thisCol = &orbitopeMatrix(0, numColsAdded);
    HighsInt* prevCol = &orbitopeMatrix(0, numColsAdded - 1);

    bool foundCand = false;

    while (true) {
      HighsInt movePos = vertexPosition[prevCol[0]];
      perm = nullptr;

      for (HighsInt k = componentData.permComponentStarts[component] + 1;
           k < componentData.permComponentStarts[component + 1]; ++k) {
        HighsInt p = componentData.permComponents[k];
        perm = symmetries.permutations.data() + p * numActiveCols;

        if (perm[movePos] != vertexGroundSet[movePos] &&
            !colSet.find(perm[movePos])) {
          foundCand = true;
          break;
        }
      }

      if (!foundCand && !triedLeftExtension) {
        // if we fail to find a permutation extending the last column directly
        // after we set up the first two columns we might try to extend column
        // zero instead of the previous one
        prevCol = &orbitopeMatrix(0, 0);
        triedLeftExtension = true;
        continue;
      }

      break;
    }

    if (!foundCand) {
      // printf("did not find next permutation moving col %d\n", prevCol[0]);
      return false;
    }

    for (HighsInt j = 0; j < orbitopeMatrix.numRows; ++j) {
      HighsInt nextVertex = perm[vertexPosition[prevCol[j]]];

      thisCol[j] = nextVertex;

      // check if this is a two cycle
      if (perm[vertexPosition[nextVertex]] != prevCol[j]) return false;

      if (!colSet.insert(thisCol[j])) {
        // printf("col already exists\n");
        return false;
      }
    }

    ++numColsAdded;
  }

  if (colSet.size() != componentSize) {
    // printf("not all columns of component are mapped\n");
    return false;
  }

  for (HighsInt col : orbitopeMatrix.matrix)
    symmetries.columnToOrbitope.insert(col, symmetries.orbitopes.size());

  symmetries.orbitopes.emplace_back(std::move(orbitopeMatrix));

  // printf("component %d is full orbitope: size %d and %d orbits\n", component,
  //        componentSize, componentData.componentNumOrbits[component]);
  return true;
}